

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O0

void __thiscall ProblemAloha::SetOScopes(ProblemAloha *this)

{
  long in_RDI;
  Index yI1;
  Scope ySC;
  Scope aSC;
  Index oI;
  string *in_stack_000000e8;
  Scope *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff48;
  Index in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  Index o;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  Index in_stack_ffffffffffffff70;
  Index in_stack_ffffffffffffff74;
  ProblemAloha *in_stack_ffffffffffffff78;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  uint local_50;
  uint local_c;
  
  for (local_c = 0; (ulong)local_c < *(ulong *)(in_RDI + 0x50); local_c = local_c + 1) {
    Scope::Scope((Scope *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    Scope::Scope((Scope *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    Scope::Insert((Scope *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  in_stack_ffffffffffffff4c);
    for (local_50 = 0; (ulong)local_50 < *(ulong *)(in_RDI + 0x718); local_50 = local_50 + 1) {
      in_stack_ffffffffffffff67 =
           areNeighbors(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                        in_stack_ffffffffffffff70);
      if ((bool)in_stack_ffffffffffffff67) {
        Scope::Insert((Scope *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      in_stack_ffffffffffffff4c);
      }
    }
    Scope::Insert((Scope *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  in_stack_ffffffffffffff4c);
    o = (Index)((ulong)&stack0xffffffffffffff77 >> 0x20);
    in_stack_ffffffffffffff54 = local_c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    Scope::Scope(in_stack_000000f0,in_stack_000000e8);
    MultiAgentDecisionProcessDiscreteFactoredStates::SetSoI_O
              ((MultiAgentDecisionProcessDiscreteFactoredStates *)
               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),o,
               (Scope *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (Scope *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (Scope *)0x9ac6ae);
    Scope::~Scope((Scope *)0x9ac6ba);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    Scope::~Scope((Scope *)0x9ac6d8);
    Scope::~Scope((Scope *)0x9ac6e5);
  }
  return;
}

Assistant:

void ProblemAloha::SetOScopes()
{
    for(Index oI=0; oI < _m_nrAgents; oI++)
    {
        Scope aSC,ySC;

        aSC.Insert(oI);
        for(Index yI1=0; yI1 < _m_nrIslands; yI1++)
            if(areNeighbors(oI,yI1)) // and on your neighbors
                aSC.Insert(yI1);
        //ySC=aSC;
        ySC.Insert(oI);

        SetSoI_O( oI,
                  aSC,
                  ySC,
                  Scope("<>") // no interdependencies between next-stage Os
            );
    }
}